

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O0

void print_help(void)

{
  printf("Usage: lddmc [OPTION...] <model> [<output-bdd>]\n\n");
  printf("  -s, --strategy=<bfs|par|sat|chaining>\n");
  printf("                             Strategy for reachability (default=par)\n");
  printf("  -w, --workers=<workers>    Number of workers (default=0: autodetect)\n");
  printf("      --count-nodes          Report #nodes for LDDs\n");
  printf("      --count-states         Report #states at each level\n");
  printf("      --count-table          Report table usage at each level\n");
  printf("      --deadlocks            Check for deadlocks\n");
  printf("      --print-matrix         Print transition matrix\n");
  printf("  -h, --help                 Give this help list\n");
  printf("      --usage                Give a short usage message\n");
  return;
}

Assistant:

static void
print_help()
{
    printf("Usage: lddmc [OPTION...] <model> [<output-bdd>]\n\n");
    printf("  -s, --strategy=<bfs|par|sat|chaining>\n");
    printf("                             Strategy for reachability (default=par)\n");
    printf("  -w, --workers=<workers>    Number of workers (default=0: autodetect)\n");
    printf("      --count-nodes          Report #nodes for LDDs\n");
    printf("      --count-states         Report #states at each level\n");
    printf("      --count-table          Report table usage at each level\n");
    printf("      --deadlocks            Check for deadlocks\n");
    printf("      --print-matrix         Print transition matrix\n");
    printf("  -h, --help                 Give this help list\n");
    printf("      --usage                Give a short usage message\n");
}